

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_task.c
# Opt level: O0

int s_task_join(s_awaiter_t *__awaiter_dummy__,void *stack)

{
  int iVar1;
  int ret;
  s_task_t *task;
  void *stack_local;
  s_awaiter_t *__awaiter_dummy___local;
  
  do {
    if (((*(byte *)((long)stack + 0x51) ^ 0xff) & 1) == 0) {
      return 0;
    }
    iVar1 = s_event_wait(__awaiter_dummy__,(s_event_t *)((long)stack + 0x10));
  } while (iVar1 == 0);
  return iVar1;
}

Assistant:

int s_task_join(__async__, void *stack) {
    s_task_t *task = (s_task_t *)stack;
    while (!task->closed) {
        int ret = s_event_wait(__await__, &task->join_event);
        if (ret != 0)
            return ret;
    }
    return 0;
}